

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_push_onto_queue(REF_INTERP ref_interp,REF_INT node)

{
  int node_00;
  uint uVar1;
  REF_DBL local_388;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT other;
  REF_INT id;
  REF_INT neighbors [200];
  int local_40;
  int local_3c;
  REF_INT nneighbor;
  REF_INT neighbor;
  REF_AGENTS ref_agents;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_INTERP pRStack_18;
  REF_INT node_local;
  REF_INTERP ref_interp_local;
  
  ref_node = (REF_NODE)ref_interp->to_grid;
  ref_agents = (REF_AGENTS)((REF_GRID)ref_node)->node;
  _nneighbor = ref_interp->ref_agents;
  ref_grid._4_4_ = node;
  pRStack_18 = ref_interp;
  if (((node < 0) || (((REF_NODE)ref_agents)->max <= node)) ||
     (((REF_NODE)ref_agents)->global[node] < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x329,
           "ref_interp_push_onto_queue","invalid node");
    ref_interp_local._4_4_ = 1;
  }
  else if (((REF_NODE)ref_agents)->ref_mpi->id == ((REF_NODE)ref_agents)->part[node]) {
    if (ref_interp->cell[node] == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x32c,"ref_interp_push_onto_queue","no cell for guess");
      ref_interp_local._4_4_ = 1;
    }
    else {
      uVar1 = ref_grid_node_list_around((REF_GRID)ref_node,node,200,&local_40,&other);
      if ((uVar1 == 0) || (uVar1 == 7)) {
        for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
          node_00 = (&other)[local_3c];
          if ((ref_agents[2].agent)->previous ==
              *(int *)(*(long *)&ref_agents[1].blank + (long)node_00 * 4)) {
            if ((pRStack_18->cell[node_00] == -1) && (pRStack_18->agent_hired[node_00] == 0)) {
              pRStack_18->agent_hired[node_00] = 1;
              uVar1 = ref_agents_push(_nneighbor,node_00,pRStack_18->part[ref_grid._4_4_],
                                      pRStack_18->cell[ref_grid._4_4_],
                                      (REF_DBL *)
                                      (&(ref_agents[1].ref_mpi)->n + (long)(node_00 * 0xf) * 2),
                                      &ref_private_macro_code_rxs);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x33a,"ref_interp_push_onto_queue",(ulong)uVar1,"enque");
                return uVar1;
              }
            }
          }
          else {
            uVar1 = ref_agents_push(_nneighbor,node_00,pRStack_18->part[ref_grid._4_4_],
                                    pRStack_18->cell[ref_grid._4_4_],
                                    (REF_DBL *)
                                    (&(ref_agents[1].ref_mpi)->n + (long)(node_00 * 0xf) * 2),
                                    &ref_private_macro_code_rxs);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x340,"ref_interp_push_onto_queue",(ulong)uVar1,"enque");
              return uVar1;
            }
            _nneighbor->agent[ref_private_macro_code_rxs].mode = REF_AGENT_SUGGESTION;
            _nneighbor->agent[ref_private_macro_code_rxs].node = -1;
            _nneighbor->agent[ref_private_macro_code_rxs].home =
                 *(REF_INT *)(*(long *)&ref_agents[1].blank + (long)node_00 * 4);
            if (((node_00 < 0) || (ref_agents->max <= node_00)) ||
               ((long)ref_agents->agent->xyz[(long)node_00 + -6] < 0)) {
              local_388 = -NAN;
            }
            else {
              local_388 = ref_agents->agent->xyz[(long)node_00 + -6];
            }
            _nneighbor->agent[ref_private_macro_code_rxs].global = (REF_GLOB)local_388;
          }
        }
        ref_interp_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x330,"ref_interp_push_onto_queue",(ulong)uVar1,"neighbors");
        ref_interp_local._4_4_ = uVar1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x32a,
           "ref_interp_push_onto_queue","ghost node");
    ref_interp_local._4_4_ = 1;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_push_onto_queue(REF_INTERP ref_interp,
                                                     REF_INT node) {
  REF_GRID ref_grid = ref_interp_to_grid(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT neighbor, nneighbor, neighbors[MAX_NODE_LIST];
  REF_INT id, other;

  RAS(ref_node_valid(ref_node, node), "invalid node");
  RAS(ref_node_owned(ref_node, node), "ghost node");

  RUS(REF_EMPTY, ref_interp->cell[node], "no cell for guess");

  RXS(ref_grid_node_list_around(ref_grid, node, MAX_NODE_LIST, &nneighbor,
                                neighbors),
      REF_INCREASE_LIMIT, "neighbors");
  for (neighbor = 0; neighbor < nneighbor; neighbor++) {
    other = neighbors[neighbor];
    if (ref_node_owned(ref_node, other)) {
      if (ref_interp->cell[other] == REF_EMPTY &&
          !(ref_interp->agent_hired[other])) {
        ref_interp->agent_hired[other] = REF_TRUE;
        RSS(ref_agents_push(ref_agents, other, ref_interp->part[node],
                            ref_interp->cell[node],
                            ref_node_xyz_ptr(ref_node, other), &id),
            "enque");
      }
    } else { /* add ghost seeding via REF_AGENT_SUGGESTION mode */
      RSS(ref_agents_push(ref_agents, other, ref_interp->part[node],
                          ref_interp->cell[node],
                          ref_node_xyz_ptr(ref_node, other), &id),
          "enque");
      ref_agent_mode(ref_agents, id) = REF_AGENT_SUGGESTION;
      ref_agent_node(ref_agents, id) = REF_EMPTY;
      ref_agent_home(ref_agents, id) = ref_node_part(ref_node, other);
      ref_agent_global(ref_agents, id) = ref_node_global(ref_node, other);
    }
  }

  return REF_SUCCESS;
}